

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

void mbedtls_mpi_core_exp_mod_optionally_safe
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *N,size_t AN_limbs,
               mbedtls_mpi_uint *E,size_t E_limbs,int E_public,mbedtls_mpi_uint *RR,
               mbedtls_mpi_uint *T)

{
  mbedtls_mpi_uint *pmVar1;
  size_t __n;
  mbedtls_mpi_uint *X_00;
  mbedtls_mpi_uint mVar2;
  ulong uVar3;
  mbedtls_mpi_uint *pmVar4;
  long lVar5;
  mbedtls_mpi_uint *X_01;
  size_t E_limb_index;
  mbedtls_mpi_uint local_80;
  mbedtls_mpi_uint *local_78;
  mbedtls_mpi_uint *local_70;
  ulong local_68;
  ulong local_60;
  mbedtls_mpi_uint *local_58;
  mbedtls_mpi_uint *local_50;
  mbedtls_mpi_uint *local_48;
  mbedtls_mpi_uint *local_40;
  long local_38;
  
  local_58 = X;
  local_50 = A;
  local_48 = E;
  exp_mod_calc_first_bit_optionally_safe(E,E_limbs,E_public,&E_limb_index,&local_68);
  local_38 = (ulong)(0x4f < E_limb_index << 6) * 2 + 1;
  local_60 = 1L << (sbyte)local_38;
  local_40 = T + (AN_limbs << (sbyte)local_38);
  pmVar1 = local_40 + AN_limbs;
  mVar2 = mbedtls_mpi_core_montmul_init(N);
  __n = AN_limbs * 8;
  switchD_004a0b15::default(T,0,__n);
  *T = 1;
  local_80 = mVar2;
  local_78 = pmVar1;
  local_70 = N;
  mbedtls_mpi_core_montmul(T,T,RR,AN_limbs,N,AN_limbs,mVar2,pmVar1);
  pmVar1 = T + AN_limbs;
  switchD_00917c1c::default(pmVar1,local_50,__n);
  X_01 = T + AN_limbs * 2;
  pmVar4 = pmVar1;
  for (uVar3 = 2; X_00 = local_58, uVar3 < local_60; uVar3 = uVar3 + 1) {
    mbedtls_mpi_core_montmul(X_01,pmVar4,pmVar1,AN_limbs,local_70,AN_limbs,local_80,local_78);
    pmVar4 = pmVar4 + AN_limbs;
    X_01 = X_01 + AN_limbs;
  }
  switchD_00917c1c::default(local_58,T,__n);
  pmVar1 = local_48;
  lVar5 = 0;
  mVar2 = 0;
  do {
    mbedtls_mpi_core_montmul(X_00,X_00,X_00,AN_limbs,local_70,AN_limbs,local_80,local_78);
    pmVar4 = local_40;
    if (local_68 == 0) {
      E_limb_index = E_limb_index - 1;
      local_68 = 0x3f;
    }
    else {
      local_68 = local_68 - 1;
    }
    lVar5 = lVar5 + 1;
    mVar2 = (ulong)((pmVar1[E_limb_index] >> (local_68 & 0x3f) & 1) != 0) + mVar2 * 2;
    if ((lVar5 == local_38) || (E_limb_index == 0 && local_68 == 0)) {
      exp_mod_table_lookup_optionally_safe(local_40,T,AN_limbs,local_60,mVar2,E_public);
      mbedtls_mpi_core_montmul(X_00,X_00,pmVar4,AN_limbs,local_70,AN_limbs,local_80,local_78);
      lVar5 = 0;
      mVar2 = 0;
    }
  } while (E_limb_index != 0 || local_68 != 0);
  return;
}

Assistant:

static void mbedtls_mpi_core_exp_mod_optionally_safe(mbedtls_mpi_uint *X,
                                                     const mbedtls_mpi_uint *A,
                                                     const mbedtls_mpi_uint *N,
                                                     size_t AN_limbs,
                                                     const mbedtls_mpi_uint *E,
                                                     size_t E_limbs,
                                                     int E_public,
                                                     const mbedtls_mpi_uint *RR,
                                                     mbedtls_mpi_uint *T)
{
    /* We'll process the bits of E from most significant
     * (limb_index=E_limbs-1, E_bit_index=biL-1) to least significant
     * (limb_index=0, E_bit_index=0). */
    size_t E_limb_index;
    size_t E_bit_index;
    exp_mod_calc_first_bit_optionally_safe(E, E_limbs, E_public,
                                           &E_limb_index, &E_bit_index);

    const size_t wsize = exp_mod_get_window_size(E_limb_index * biL);
    const size_t welem = ((size_t) 1) << wsize;

    /* This is how we will use the temporary storage T, which must have space
     * for table_limbs, select_limbs and (2 * AN_limbs + 1) for montmul. */
    const size_t table_limbs  = welem * AN_limbs;
    const size_t select_limbs = AN_limbs;

    /* Pointers to specific parts of the temporary working memory pool */
    mbedtls_mpi_uint *const Wtable  = T;
    mbedtls_mpi_uint *const Wselect = Wtable  +  table_limbs;
    mbedtls_mpi_uint *const temp    = Wselect + select_limbs;

    /*
     * Window precomputation
     */

    const mbedtls_mpi_uint mm = mbedtls_mpi_core_montmul_init(N);

    /* Set Wtable[i] = A^i (in Montgomery representation) */
    exp_mod_precompute_window(A, N, AN_limbs,
                              mm, RR,
                              welem, Wtable, temp);

    /*
     * Fixed window exponentiation
     */

    /* X = 1 (in Montgomery presentation) initially */
    memcpy(X, Wtable, AN_limbs * ciL);

    /* At any given time, window contains window_bits bits from E.
     * window_bits can go up to wsize. */
    size_t window_bits = 0;
    mbedtls_mpi_uint window = 0;

    do {
        /* Square */
        mbedtls_mpi_core_montmul(X, X, X, AN_limbs, N, AN_limbs, mm, temp);

        /* Move to the next bit of the exponent */
        if (E_bit_index == 0) {
            --E_limb_index;
            E_bit_index = biL - 1;
        } else {
            --E_bit_index;
        }
        /* Insert next exponent bit into window */
        ++window_bits;
        window <<= 1;
        window |= (E[E_limb_index] >> E_bit_index) & 1;

        /* Clear window if it's full. Also clear the window at the end,
         * when we've finished processing the exponent. */
        if (window_bits == wsize ||
            (E_bit_index == 0 && E_limb_index == 0)) {

            exp_mod_table_lookup_optionally_safe(Wselect, Wtable, AN_limbs, welem,
                                                 window, E_public);
            /* Multiply X by the selected element. */
            mbedtls_mpi_core_montmul(X, X, Wselect, AN_limbs, N, AN_limbs, mm,
                                     temp);
            window = 0;
            window_bits = 0;
        }
    } while (!(E_bit_index == 0 && E_limb_index == 0));
}